

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O3

ssize_t extract_pack_stream(archive_read *a,size_t minimum)

{
  size_t *psVar1;
  uint64_t *puVar2;
  long lVar3;
  byte bVar4;
  _7zip *zip;
  uint64_t uVar5;
  uchar *puVar6;
  lzma_ret lVar7;
  int iVar8;
  Bool BVar9;
  uint uVar10;
  uchar *puVar11;
  uint8_t *__src;
  ssize_t sVar12;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  size_t sVar13;
  void *pvVar14;
  unsigned_long uVar15;
  ulong uVar16;
  long lVar17;
  size_t sVar18;
  char *pcVar19;
  uchar *puVar20;
  uint uVar21;
  uchar *puVar22;
  size_t sVar23;
  long lVar24;
  uchar *puVar25;
  ulong uVar26;
  uint64_t uVar27;
  size_t sVar28;
  uint uVar29;
  uint uVar30;
  ulong uVar31;
  uchar *puVar32;
  ulong uVar33;
  ulong uVar34;
  size_t sVar35;
  bool bVar36;
  bool bVar37;
  uint64_t local_b8;
  int local_b0;
  int local_ac;
  bz_stream *local_a8;
  lzma_stream *local_a0;
  ulong local_98;
  CPpmd7z_RangeDec *local_90;
  long local_88;
  ulong local_80;
  ulong local_78;
  long local_70;
  uchar *local_68;
  code *local_60;
  IByteIn *local_58;
  z_streamp local_50;
  size_t local_48;
  CPpmd7 *local_40;
  code *local_38;
  
  zip = (_7zip *)a->format->data;
  if ((zip->codec == 0) && (zip->codec2 == 0xffffffffffffffff)) {
    pvVar14 = __archive_read_ahead(a,minimum + (minimum == 0),(ssize_t *)&local_b8);
    if (0 < (long)local_b8 && pvVar14 != (void *)0x0) {
      uVar27 = zip->folder_outbytes_remaining;
      uVar5 = zip->pack_stream_inbytes_remaining;
      if ((long)uVar5 <= (long)local_b8) {
        local_b8 = uVar5;
      }
      zip->pack_stream_inbytes_remaining = uVar5 - local_b8;
      if ((long)uVar27 <= (long)local_b8) {
        local_b8 = uVar27;
      }
      zip->folder_outbytes_remaining = uVar27 - local_b8;
      zip->uncompressed_buffer_bytes_remaining = local_b8;
      return 0;
    }
  }
  else {
    puVar22 = zip->uncompressed_buffer;
    if (puVar22 == (uchar *)0x0) {
      sVar18 = 0x10000;
      if (0x10000 < minimum) {
        sVar18 = minimum + 0x3ff & 0xfffffffffffffc00;
      }
      zip->uncompressed_buffer_size = sVar18;
      puVar22 = (uchar *)malloc(sVar18);
      zip->uncompressed_buffer = puVar22;
      if (puVar22 == (uchar *)0x0) {
LAB_003e1e6a:
        pcVar19 = "No memory for 7-Zip decompression";
        iVar8 = 0xc;
        goto LAB_003e298b;
      }
LAB_003e1eaf:
      zip->uncompressed_buffer_bytes_remaining = 0;
    }
    else if (zip->uncompressed_buffer_size < minimum) {
      puVar25 = zip->uncompressed_buffer_pointer;
      uVar33 = minimum + 0x3ff & 0xfffffffffffffc00;
      puVar11 = (uchar *)realloc(puVar22,uVar33);
      if (puVar11 == (uchar *)0x0) goto LAB_003e1e6a;
      lVar24 = (long)puVar25 - (long)puVar22;
      if (puVar25 == (uchar *)0x0) {
        lVar24 = 0;
      }
      zip->uncompressed_buffer = puVar11;
      zip->uncompressed_buffer_size = uVar33;
      puVar22 = puVar11;
LAB_003e1e96:
      if (lVar24 != 0) {
        memmove(puVar22,puVar22 + lVar24,zip->uncompressed_buffer_bytes_remaining);
      }
    }
    else {
      if (minimum <= zip->uncompressed_buffer_bytes_remaining) goto LAB_003e1eaf;
      if (zip->uncompressed_buffer_pointer != (uchar *)0x0) {
        lVar24 = (long)zip->uncompressed_buffer_pointer - (long)puVar22;
        goto LAB_003e1e96;
      }
    }
    zip->uncompressed_buffer_pointer = (uchar *)0x0;
    local_48 = minimum;
    __src = (uint8_t *)__archive_read_ahead(a,1,(ssize_t *)&local_b8);
    if (0 < (long)local_b8) {
      local_68 = zip->odd_bcj;
      local_58 = &zip->bytein;
      local_90 = &zip->range_dec;
      local_60 = Ppmd7z_RangeDec_Init;
      local_38 = Ppmd7_DecodeSymbol;
      local_40 = &zip->ppmd7_context;
      local_50 = &zip->stream;
      local_a8 = &zip->bzstream;
      local_a0 = &zip->lzstream;
      do {
        sVar23 = zip->uncompressed_buffer_size;
        sVar13 = zip->uncompressed_buffer_bytes_remaining;
        puVar22 = zip->uncompressed_buffer + sVar13;
        uVar34 = sVar23 - sVar13;
        uVar33 = zip->pack_stream_inbytes_remaining;
        uVar27 = local_b8;
        if (uVar33 <= local_b8) {
          uVar27 = uVar33;
        }
        uVar15 = zip->codec2;
        sVar28 = uVar34;
        puVar25 = puVar22;
        if (uVar15 != 0x3030103 || zip->codec == 0x21) {
LAB_003e207e:
          sVar23 = sVar28;
          puVar11 = puVar25;
          if (uVar15 == 0x303011b) {
            sVar13 = zip->tmp_stream_bytes_remaining;
            if (sVar13 == 0) {
LAB_003e2104:
              sVar28 = zip->tmp_stream_buff_size;
              puVar11 = zip->tmp_stream_buff;
              goto LAB_003e211a;
            }
            sVar12 = Bcj2_Decode(zip,puVar25,sVar28);
            if (-1 < sVar12) {
              zip->main_stream_bytes_remaining =
                   zip->main_stream_bytes_remaining + (zip->tmp_stream_bytes_remaining - sVar13);
              sVar23 = sVar28 - sVar12;
              if ((uVar33 == 0) || (sVar23 == 0)) {
                uVar26 = uVar34 - sVar23;
                uVar10 = 0;
                if (uVar33 == 0) {
                  uVar10 = (uint)(zip->tmp_stream_bytes_remaining != 0);
                }
                goto LAB_003e225f;
              }
              puVar25 = puVar25 + sVar12;
              goto LAB_003e2104;
            }
LAB_003e2971:
            pcVar19 = "BCJ2 conversion Failed";
          }
          else {
LAB_003e211a:
            uVar15 = zip->codec;
            local_98 = uVar33;
            if ((long)uVar15 < 0x30401) {
              if (uVar15 == 0) {
                uVar33 = sVar28;
                if (uVar27 < sVar28) {
                  uVar33 = uVar27;
                }
                memcpy(puVar11,__src,uVar33);
                sVar35 = uVar27 - uVar33;
                sVar28 = sVar28 - uVar33;
                uVar33 = (ulong)(local_98 == 0);
              }
              else {
                if ((uVar15 != 0x21) && (uVar15 != 0x30101)) goto LAB_003e297a;
                (zip->lzstream).next_in = __src;
                (zip->lzstream).avail_in = uVar27;
                (zip->lzstream).next_out = puVar11;
                (zip->lzstream).avail_out = sVar28;
                lVar7 = lzma_code(local_a0,LZMA_RUN);
                uVar33 = CONCAT44(extraout_var,lVar7);
                if (lVar7 != LZMA_OK) {
                  if (lVar7 != LZMA_STREAM_END) {
                    pcVar19 = "Decompression failed(%d)";
                    goto LAB_003e29bb;
                  }
                  lzma_end(local_a0);
                  zip->lzstream_valid = 0;
                }
                sVar35 = (zip->lzstream).avail_in;
                sVar28 = (zip->lzstream).avail_out;
              }
LAB_003e2394:
              uVar26 = uVar34 - sVar28;
              uVar10 = (uint)uVar33;
              if (zip->codec == 0x21) {
LAB_003e2724:
                uVar15 = zip->codec2;
              }
              else {
                uVar15 = zip->codec2;
                if (uVar15 == 0x3030103) {
                  if (uVar26 < 5) {
                    uVar33 = 0;
                  }
                  else {
                    puVar11 = (uchar *)zip->bcj_prevPosT;
                    uVar29 = zip->bcj_prevMask;
                    uVar31 = (ulong)uVar29;
                    puVar32 = puVar22 + (uVar26 - 4);
                    puVar20 = puVar22;
                    if (puVar22 < puVar32) {
                      local_70 = -(long)puVar22;
                      uVar21 = (uint)puVar22;
                      local_ac = uVar21 - zip->bcj_ip;
                      local_b0 = (uVar21 - zip->bcj_ip) + -1;
                      local_78 = (ulong)~uVar21;
                      puVar6 = puVar22;
                      do {
                        puVar20 = puVar6;
                        uVar29 = (uint)uVar31;
                        lVar24 = 0;
                        while ((puVar20[lVar24] & 0xfe) != 0xe8) {
                          lVar3 = lVar24 + 1;
                          lVar24 = lVar24 + 1;
                          if (puVar32 <= puVar20 + lVar3) {
                            puVar20 = puVar20 + lVar24;
                            goto LAB_003e269c;
                          }
                        }
                        lVar3 = local_70 + (long)puVar20;
                        uVar31 = 0;
                        if ((ulong)((lVar3 - (long)puVar11) + lVar24) < 4) {
                          uVar29 = uVar29 << ((char)lVar24 +
                                              (((char)~uVar21 + (char)puVar20) - (char)puVar11) &
                                             0x1fU);
                          uVar30 = uVar29 & 7;
                          if (uVar30 == 0) goto LAB_003e24c4;
                          if (((0xe8U >> uVar30 & 1) == 0) &&
                             ((byte)(puVar20[lVar24 + (4 - (ulong)*(byte *)((long)&
                                                  x86_Convert_kMaskToBitNumber + (ulong)uVar30))] -
                                    1) < 0xfe)) {
                            uVar31 = (ulong)uVar30;
                            goto LAB_003e24c4;
                          }
LAB_003e25b7:
                          uVar31 = (ulong)((uVar29 & 3) * 2 + 1);
                          lVar17 = 1;
                        }
                        else {
LAB_003e24c4:
                          bVar4 = puVar20[lVar24 + 4];
                          uVar29 = (uint)uVar31;
                          if ((bVar4 != 0xff) && (bVar4 != 0)) goto LAB_003e25b7;
                          uVar16 = ((ulong)(uint)(local_ac - (int)puVar20) +
                                   (ulong)((uint)puVar20[lVar24 + 1] |
                                          (uint)puVar20[lVar24 + 2] << 8 |
                                          (uint)puVar20[lVar24 + 3] << 0x10 | (uint)bVar4 << 0x18))
                                   - lVar24;
                          uVar30 = (uint)uVar16;
                          if (uVar29 != 0) {
                            while( true ) {
                              uVar30 = (uint)uVar16;
                              uVar29 = uVar30 >> (*(char *)((long)&x86_Convert_kMaskToBitNumber +
                                                           uVar31) * -8 + 0x18U & 0x1f);
                              if (((char)uVar29 != -1) &&
                                 (local_88 = lVar3, local_80 = uVar33, (uVar29 & 0xff) != 0)) break;
                              uVar16 = (ulong)(((local_b0 - (int)puVar20) - (int)lVar24) -
                                              (uVar30 ^ -1 << (*(char *)((long)&
                                                  x86_Convert_kMaskToBitNumber + uVar31) * -8 &
                                                  0x1fU)));
                            }
                          }
                          puVar20[lVar24 + 4] = (uchar)((int)(uVar30 << 7) >> 0x1f);
                          puVar20[lVar24 + 3] = (uchar)(uVar30 >> 0x10);
                          puVar20[lVar24 + 2] = (uchar)(uVar30 >> 8);
                          puVar20[lVar24 + 1] = (uchar)uVar30;
                          lVar17 = 5;
                        }
                        uVar29 = (uint)uVar31;
                        puVar11 = (uchar *)(lVar3 + lVar24);
                        puVar6 = puVar20 + lVar17 + lVar24;
                      } while (puVar20 + lVar17 + lVar24 < puVar32);
                      puVar11 = puVar20 + (lVar24 - (long)puVar22);
                      puVar20 = puVar20 + lVar24 + lVar17;
                    }
LAB_003e269c:
                    uVar33 = (long)puVar20 - (long)puVar22;
                    zip->bcj_prevPosT = (size_t)puVar11;
                    zip->bcj_prevMask = uVar29;
                    zip->bcj_ip = zip->bcj_ip + (int)uVar33;
                  }
                  sVar18 = uVar26 - uVar33;
                  zip->odd_bcj_size = sVar18;
                  if ((((sVar18 == 0) || (uVar10 == 1)) || (4 < sVar18)) || (local_98 == 0)) {
                    zip->odd_bcj_size = 0;
                  }
                  else {
                    memcpy(local_68,puVar22 + uVar33,sVar18);
                    uVar26 = uVar33;
                  }
                  goto LAB_003e2724;
                }
              }
              if (uVar15 == 0x303011b) {
                uVar33 = zip->tmp_stream_buff_size - sVar28;
                if (zip->main_stream_bytes_remaining <= uVar33) {
                  uVar33 = zip->main_stream_bytes_remaining;
                }
                zip->tmp_stream_bytes_avail = uVar33;
                zip->tmp_stream_bytes_remaining = uVar33;
                sVar12 = Bcj2_Decode(zip,puVar25,sVar23);
                if (sVar12 < 0) goto LAB_003e2971;
                zip->main_stream_bytes_remaining =
                     zip->main_stream_bytes_remaining +
                     (zip->tmp_stream_bytes_remaining - zip->tmp_stream_bytes_avail);
                uVar26 = (uVar34 - sVar23) + sVar12;
              }
              if (1 < uVar10) {
                return -0x1e;
              }
              sVar35 = uVar27 - sVar35;
              goto LAB_003e27ba;
            }
            if (uVar15 == 0x30401) {
              if (((zip->ppmd7_valid == 0) || (iVar8 = zip->ppmd7_stat, iVar8 < 0)) || (sVar28 == 0)
                 ) {
LAB_003e297a:
                pcVar19 = "Decompression internal error";
                goto LAB_003e2986;
              }
              (zip->ppstream).next_in = __src;
              (zip->ppstream).avail_in = uVar27;
              (zip->ppstream).next_out = puVar11;
              (zip->ppstream).avail_out = sVar28;
              if (iVar8 == 0) {
                (zip->bytein).a = a;
                (zip->bytein).Read = ppmd_read;
                (zip->range_dec).Stream = local_58;
                BVar9 = (*local_60)(local_90);
                if (BVar9 == 0) {
                  zip->ppmd7_stat = -1;
                  pcVar19 = "Failed to initialize PPMd range decorder";
                  goto LAB_003e2986;
                }
                if ((zip->ppstream).overconsumed != 0) {
LAB_003e2948:
                  zip->ppmd7_stat = -1;
                  return -0x1e;
                }
                zip->ppmd7_stat = 1;
              }
              if (uVar33 == 0) {
                uVar26 = zip->folder_outbytes_remaining;
              }
              else {
                uVar26 = 0;
              }
              do {
                uVar31 = uVar26;
                iVar8 = (*local_38)(local_40,&local_90->p);
                if (iVar8 < 0) {
                  zip->ppmd7_stat = -1;
                  pcVar19 = "Failed to decode PPMd";
                  goto LAB_003e28da;
                }
                if ((zip->ppstream).overconsumed != 0) goto LAB_003e2948;
                puVar11 = (zip->ppstream).next_out;
                (zip->ppstream).next_out = puVar11 + 1;
                *puVar11 = (uchar)iVar8;
                sVar28 = (zip->ppstream).avail_out - 1;
                (zip->ppstream).avail_out = sVar28;
                (zip->ppstream).total_out = (zip->ppstream).total_out + 1;
                sVar35 = (zip->ppstream).avail_in;
                uVar33 = 0;
                if (sVar28 == 0) {
                  sVar28 = 0;
                  break;
                }
                uVar26 = uVar31 - 1;
                if (uVar31 == 0) {
                  uVar26 = uVar33;
                }
              } while ((sVar35 != 0) || (sVar35 = 0, 1 < uVar31));
              goto LAB_003e2394;
            }
            if (uVar15 == 0x40108) {
              (zip->stream).next_in = __src;
              (zip->stream).avail_in = (uint)uVar27;
              (zip->stream).next_out = puVar11;
              (zip->stream).avail_out = (uint)sVar28;
              uVar10 = cm_zlib_inflate(local_50,0);
              uVar33 = CONCAT44(extraout_var_01,uVar10);
              if (1 < uVar10) {
                pcVar19 = "File decompression failed (%d)";
LAB_003e29bb:
                archive_set_error(&a->archive,-1,pcVar19,uVar33 & 0xffffffff);
                return -0x1e;
              }
              sVar35 = (size_t)(zip->stream).avail_in;
              sVar28 = (size_t)(zip->stream).avail_out;
              goto LAB_003e2394;
            }
            if (uVar15 != 0x40202) goto LAB_003e297a;
            (zip->bzstream).next_in = (char *)__src;
            (zip->bzstream).avail_in = (uint)uVar27;
            (zip->bzstream).next_out = (char *)puVar11;
            (zip->bzstream).avail_out = (uint)sVar28;
            iVar8 = BZ2_bzDecompress(local_a8);
            uVar33 = CONCAT44(extraout_var_00,iVar8);
            if (iVar8 == 0) {
LAB_003e222f:
              sVar35 = (size_t)(zip->bzstream).avail_in;
              sVar28 = (size_t)(zip->bzstream).avail_out;
              goto LAB_003e2394;
            }
            if (iVar8 == 4) {
              iVar8 = BZ2_bzDecompressEnd(local_a8);
              if (iVar8 == 0) {
                zip->bzstream_valid = 0;
                uVar33 = 1;
                goto LAB_003e222f;
              }
              pcVar19 = "Failed to clean up decompressor";
            }
            else {
              pcVar19 = "bzip decompression failed";
            }
          }
LAB_003e2986:
          iVar8 = -1;
          goto LAB_003e298b;
        }
        if (uVar34 < 5 && uVar33 != 0) {
          if (zip->odd_bcj_size == 0) goto LAB_003e2065;
          uVar27 = zip->folder_outbytes_remaining;
          bVar37 = false;
          sVar35 = 0;
          bVar36 = false;
          uVar26 = 0;
        }
        else {
          if (uVar34 != 0 && zip->odd_bcj_size != 0) {
            lVar24 = 0;
            do {
              puVar22[lVar24] = zip->odd_bcj[lVar24];
              lVar3 = lVar24 + 1;
              psVar1 = &zip->odd_bcj_size;
              *psVar1 = *psVar1 - 1;
              if (*psVar1 == 0) break;
              bVar37 = uVar34 - 1 != lVar24;
              lVar24 = lVar3;
            } while (bVar37);
            puVar25 = puVar22 + lVar3;
            sVar28 = uVar34 - lVar3;
          }
LAB_003e2065:
          if ((uVar33 != 0) && (sVar28 != 0)) {
            uVar15 = zip->codec2;
            goto LAB_003e207e;
          }
          uVar10 = (uint)(uVar33 == 0);
          uVar26 = uVar34 - sVar28;
LAB_003e225f:
          sVar35 = 0;
LAB_003e27ba:
          uVar27 = zip->folder_outbytes_remaining;
          if (uVar27 <= uVar26) {
            uVar26 = uVar27;
          }
          bVar36 = uVar10 != 0;
          puVar2 = &zip->pack_stream_inbytes_remaining;
          *puVar2 = *puVar2 - sVar35;
          bVar37 = *puVar2 == 0;
          sVar23 = zip->uncompressed_buffer_size;
          sVar13 = zip->uncompressed_buffer_bytes_remaining;
        }
        zip->folder_outbytes_remaining = uVar27 - uVar26;
        uVar33 = sVar13 + uVar26;
        zip->uncompressed_buffer_bytes_remaining = uVar33;
        zip->pack_stream_bytes_unconsumed = sVar35;
        if (((uVar33 == sVar23) ||
            ((zip->codec2 == 0x3030103 && (sVar23 < uVar33 + 5 && zip->odd_bcj_size != 0)))) ||
           ((bool)(bVar37 & uVar27 == uVar26))) {
          if (local_48 <= uVar33) {
            zip->uncompressed_buffer_pointer = zip->uncompressed_buffer;
            return 0;
          }
LAB_003e28ee:
          pcVar19 = "Damaged 7-Zip archive";
          goto LAB_003e2986;
        }
        if ((bool)(bVar36 | (uVar26 == 0 && sVar35 == 0))) goto LAB_003e28ee;
        read_consume(a);
        __src = (uint8_t *)__archive_read_ahead(a,1,(ssize_t *)&local_b8);
      } while (0 < (long)local_b8);
    }
  }
  pcVar19 = "Truncated 7-Zip file body";
LAB_003e28da:
  iVar8 = 0x54;
LAB_003e298b:
  archive_set_error(&a->archive,iVar8,pcVar19);
  return -0x1e;
}

Assistant:

static ssize_t
extract_pack_stream(struct archive_read *a, size_t minimum)
{
	struct _7zip *zip = (struct _7zip *)a->format->data;
	ssize_t bytes_avail;
	int r;

	if (zip->codec == _7Z_COPY && zip->codec2 == (unsigned long)-1) {
		if (minimum == 0)
			minimum = 1;
		if (__archive_read_ahead(a, minimum, &bytes_avail) == NULL
		    || bytes_avail <= 0) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Truncated 7-Zip file body");
			return (ARCHIVE_FATAL);
		}
		if (bytes_avail > (ssize_t)zip->pack_stream_inbytes_remaining)
			bytes_avail = (ssize_t)zip->pack_stream_inbytes_remaining;
		zip->pack_stream_inbytes_remaining -= bytes_avail;
		if (bytes_avail > (ssize_t)zip->folder_outbytes_remaining)
			bytes_avail = (ssize_t)zip->folder_outbytes_remaining;
		zip->folder_outbytes_remaining -= bytes_avail;
		zip->uncompressed_buffer_bytes_remaining = bytes_avail;
		return (ARCHIVE_OK);
	}

	/* If the buffer hasn't been allocated, allocate it now. */
	if (zip->uncompressed_buffer == NULL) {
		zip->uncompressed_buffer_size = UBUFF_SIZE;
		if (zip->uncompressed_buffer_size < minimum) {
			zip->uncompressed_buffer_size = minimum + 1023;
			zip->uncompressed_buffer_size &= ~0x3ff;
		}
		zip->uncompressed_buffer =
		    malloc(zip->uncompressed_buffer_size);
		if (zip->uncompressed_buffer == NULL) {
			archive_set_error(&a->archive, ENOMEM,
			    "No memory for 7-Zip decompression");
			return (ARCHIVE_FATAL);
		}
		zip->uncompressed_buffer_bytes_remaining = 0;
	} else if (zip->uncompressed_buffer_size < minimum ||
	    zip->uncompressed_buffer_bytes_remaining < minimum) {
		/*
		 * Make sure the uncompressed buffer can have bytes
		 * at least `minimum' bytes.
		 * NOTE: This case happen when reading the header.
		 */
		size_t used;
		if (zip->uncompressed_buffer_pointer != 0)
			used = zip->uncompressed_buffer_pointer -
				zip->uncompressed_buffer;
		else
			used = 0;
		if (zip->uncompressed_buffer_size < minimum) {
			/*
			 * Expand the uncompressed buffer up to
			 * the minimum size.
			 */
			void *p;
			size_t new_size;

			new_size = minimum + 1023;
			new_size &= ~0x3ff;
			p = realloc(zip->uncompressed_buffer, new_size);
			if (p == NULL) {
				archive_set_error(&a->archive, ENOMEM,
				    "No memory for 7-Zip decompression");
				return (ARCHIVE_FATAL);
			}
			zip->uncompressed_buffer = (unsigned char *)p;
			zip->uncompressed_buffer_size = new_size;
		}
		/*
		 * Move unconsumed bytes to the head.
		 */
		if (used) {
			memmove(zip->uncompressed_buffer,
				zip->uncompressed_buffer + used,
				zip->uncompressed_buffer_bytes_remaining);
		}
	} else
		zip->uncompressed_buffer_bytes_remaining = 0;
	zip->uncompressed_buffer_pointer = NULL;
	for (;;) {
		size_t bytes_in, bytes_out;
		const void *buff_in;
		unsigned char *buff_out;
		int end_of_data;

		/*
		 * Note: '1' here is a performance optimization.
		 * Recall that the decompression layer returns a count of
		 * available bytes; asking for more than that forces the
		 * decompressor to combine reads by copying data.
		 */
		buff_in = __archive_read_ahead(a, 1, &bytes_avail);
		if (bytes_avail <= 0) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Truncated 7-Zip file body");
			return (ARCHIVE_FATAL);
		}

		buff_out = zip->uncompressed_buffer
			+ zip->uncompressed_buffer_bytes_remaining;
		bytes_out = zip->uncompressed_buffer_size
			- zip->uncompressed_buffer_bytes_remaining;
		bytes_in = bytes_avail;
		if (bytes_in > zip->pack_stream_inbytes_remaining)
			bytes_in = (size_t)zip->pack_stream_inbytes_remaining;
		/* Drive decompression. */
		r = decompress(a, zip, buff_out, &bytes_out,
			buff_in, &bytes_in);
		switch (r) {
		case ARCHIVE_OK:
			end_of_data = 0;
			break;
		case ARCHIVE_EOF:
			end_of_data = 1;
			break;
		default:
			return (ARCHIVE_FATAL);
		}
		zip->pack_stream_inbytes_remaining -= bytes_in;
		if (bytes_out > zip->folder_outbytes_remaining)
			bytes_out = (size_t)zip->folder_outbytes_remaining;
		zip->folder_outbytes_remaining -= bytes_out;
		zip->uncompressed_buffer_bytes_remaining += bytes_out;
		zip->pack_stream_bytes_unconsumed = bytes_in;

		/*
		 * Continue decompression until uncompressed_buffer is full.
		 */
		if (zip->uncompressed_buffer_bytes_remaining ==
		    zip->uncompressed_buffer_size)
			break;
		if (zip->codec2 == _7Z_X86 && zip->odd_bcj_size &&
		    zip->uncompressed_buffer_bytes_remaining + 5 >
		    zip->uncompressed_buffer_size)
			break;
		if (zip->pack_stream_inbytes_remaining == 0 &&
		    zip->folder_outbytes_remaining == 0)
			break;
		if (end_of_data || (bytes_in == 0 && bytes_out == 0)) {
			archive_set_error(&(a->archive),
			    ARCHIVE_ERRNO_MISC, "Damaged 7-Zip archive");
			return (ARCHIVE_FATAL);
		}
		read_consume(a);
	}
	if (zip->uncompressed_buffer_bytes_remaining < minimum) {
		archive_set_error(&(a->archive),
		    ARCHIVE_ERRNO_MISC, "Damaged 7-Zip archive");
		return (ARCHIVE_FATAL);
	}
	zip->uncompressed_buffer_pointer = zip->uncompressed_buffer;
	return (ARCHIVE_OK);
}